

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace14.c
# Opt level: O0

void lace_start(uint _n_workers,size_t dqsize)

{
  uint uVar1;
  ulong uVar2;
  uint local_94;
  pthread_t local_90;
  pthread_t res;
  undefined8 uStack_80;
  uint i;
  size_t local_78;
  size_t size;
  rlimit lim;
  pthread_attr_t worker_attr;
  size_t to_allocate;
  size_t sStack_18;
  uint n_pus;
  size_t dqsize_local;
  uint _n_workers_local;
  
  uVar1 = lace_get_pu_count();
  local_94 = _n_workers;
  if (_n_workers == 0) {
    local_94 = uVar1;
  }
  n_workers = local_94;
  sStack_18 = dqsize;
  if (dqsize == 0) {
    sStack_18 = default_dqsize;
  }
  LOCK();
  lace_quits = 0;
  UNLOCK();
  workers_running = 0;
  default_dqsize = sStack_18;
  lace_barrier_init();
  suspend_semaphore = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  sem_init((sem_t *)&suspend_semaphore,0,0);
  LOCK();
  must_suspend = 0;
  UNLOCK();
  LOCK();
  lace_awaken_count = 0;
  UNLOCK();
  uVar2 = (ulong)n_workers * 8 + 0x3f & 0xffffffffffffffc0;
  workers = (Worker **)aligned_alloc(0x40,uVar2);
  workers_p = (WorkerP **)aligned_alloc(0x40,uVar2);
  workers_memory = (worker_data **)aligned_alloc(0x40);
  if (((workers != (Worker **)0x0) && (workers_p != (WorkerP **)0x0)) &&
     (workers_memory != (worker_data **)0x0)) {
    memset(workers,0,(ulong)n_workers << 3);
    workers_memory_size = sStack_18 * 0x80 + 0xc0;
    pthread_attr_init((pthread_attr_t *)&lim.rlim_max);
    if (stacksize == 0) {
      getrlimit(RLIMIT_STACK,(rlimit *)&size);
      local_78 = size;
      if (0x1000000 < size) {
        local_78 = 0x1000000;
      }
      pthread_attr_setstacksize((pthread_attr_t *)&lim.rlim_max,local_78);
    }
    else {
      pthread_attr_setstacksize((pthread_attr_t *)&lim.rlim_max,stacksize);
    }
    if (verbosity != 0) {
      fprintf(_stdout,"Initializing Lace, %u available cores, %d workers.\n",(ulong)uVar1,
              (ulong)n_workers);
    }
    uStack_80 = 0;
    lace_newframe.t = (Task *)0x0;
    if (verbosity != 0) {
      fprintf(_stdout,"Lace startup, creating %d worker threads with program stack %zu bytes.\n",
              (ulong)n_workers,stacksize);
    }
    for (res._4_4_ = 0; res._4_4_ < n_workers; res._4_4_ = res._4_4_ + 1) {
      pthread_create(&local_90,(pthread_attr_t *)&lim.rlim_max,lace_worker_thread,
                     (void *)(ulong)res._4_4_);
    }
    lace_resume();
    pthread_attr_destroy((pthread_attr_t *)&lim.rlim_max);
    return;
  }
  fprintf(_stderr,"Lace error: unable to allocate memory for the workers!\n");
  exit(1);
}

Assistant:

void
lace_start(unsigned int _n_workers, size_t dqsize)
{
#if LACE_USE_HWLOC
    // Initialize topology and information about cpus
    hwloc_topology_init(&topo);
    hwloc_topology_load(topo);

    n_nodes = hwloc_get_nbobjs_by_type(topo, HWLOC_OBJ_NODE);
    n_cores = hwloc_get_nbobjs_by_type(topo, HWLOC_OBJ_CORE);
    n_pus = hwloc_get_nbobjs_by_type(topo, HWLOC_OBJ_PU);
#else
    unsigned int n_pus = lace_get_pu_count();
#endif

    // Initialize globals
    n_workers = _n_workers == 0 ? n_pus : _n_workers;
    if (dqsize != 0) default_dqsize = dqsize;
    else dqsize = default_dqsize;
    lace_quits = 0;
    atomic_store_explicit(&workers_running, 0, memory_order_relaxed);

    // Initialize Lace barrier
    lace_barrier_init();

    // Create suspend semaphore
    memset(&suspend_semaphore, 0, sizeof(sem_t));
    sem_init(&suspend_semaphore, 0, 0);

    must_suspend = 0;
    lace_awaken_count = 0;

    // Allocate array with all workers
    // first make sure that the amount to allocate (n_workers times pointer) is a multiple of LINE_SIZE
    size_t to_allocate = n_workers * sizeof(void*);
    to_allocate = (to_allocate+LINE_SIZE-1) & (~(LINE_SIZE-1));
#if defined(_MSC_VER) || defined(__MINGW64_VERSION_MAJOR)
    workers = _aligned_malloc(to_allocate, LINE_SIZE);
    workers_p = _aligned_malloc(to_allocate, LINE_SIZE);
    workers_memory = _aligned_malloc(to_allocate, LINE_SIZE);
#elif defined(__MINGW32__)
    workers = __mingw_aligned_malloc(to_allocate, LINE_SIZE);
    workers_p = __mingw_aligned_malloc(to_allocate, LINE_SIZE);
    workers_memory = __mingw_aligned_malloc(to_allocate, LINE_SIZE);
#else
    workers = aligned_alloc(LINE_SIZE, to_allocate);
    workers_p = aligned_alloc(LINE_SIZE, to_allocate);
    workers_memory = aligned_alloc(LINE_SIZE, to_allocate);
#endif
    if (workers == 0 || workers_p == 0 || workers_memory == 0) {
        fprintf(stderr, "Lace error: unable to allocate memory for the workers!\n");
        exit(1);
    }

    // Ensure worker array is set to 0 initially
    memset(workers, 0, n_workers*sizeof(Worker*));

    // Compute memory size for each worker
    workers_memory_size = sizeof(worker_data) + sizeof(Task) * dqsize;

#ifndef __linux__
    // Create pthread key
    pthread_key_create(&current_worker_key, NULL);
#endif

    // Prepare structures for thread creation
    pthread_attr_t worker_attr;
    pthread_attr_init(&worker_attr);

    // Set the stack size
    if (stacksize != 0) {
        pthread_attr_setstacksize(&worker_attr, stacksize);
    } else {
	// on certain systems, the default stack size is too small (e.g. OSX)
	// so by default, we just pick the current RLIMIT_STACK or 16M whichever is smallest
#ifndef _WIN32
	struct rlimit lim;
	getrlimit(RLIMIT_STACK, &lim);
	size_t size = lim.rlim_cur;
	if (size > 16*1024*1024) size = 16*1024*1024;
#else
	size_t size = 16*1024*1024;
#endif
        pthread_attr_setstacksize(&worker_attr, size);
    }

    if (verbosity) {
#if LACE_USE_HWLOC
        fprintf(stdout, "Initializing Lace, %u nodes, %u cores, %u logical processors, %d workers.\n", n_nodes, n_cores, n_pus, n_workers);
#else
        fprintf(stdout, "Initializing Lace, %u available cores, %d workers.\n", n_pus, n_workers);
#endif
    }

    // Prepare lace_init structure
    atomic_store_explicit(&lace_newframe.t, NULL, memory_order_relaxed);

#if LACE_PIE_TIMES
    // Initialize counters for pie times
    us_elapsed_start();
    count_at_start = gethrtime();
#endif

    /* Report startup if verbose */
    if (verbosity) {
        fprintf(stdout, "Lace startup, creating %d worker threads with program stack %zu bytes.\n", n_workers, stacksize);
    }

    /* Spawn all workers */
    for (unsigned int i=0; i<n_workers; i++) {
        pthread_t res;
        pthread_create(&res, &worker_attr, lace_worker_thread, (void*)(size_t)i);
    }

    /* Make sure we start resumed */
    lace_resume();

    pthread_attr_destroy(&worker_attr);
}